

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *con,int param_3)

{
  double dVar1;
  double dVar2;
  AlgConRange rng_00;
  bool bVar3;
  bool bVar4;
  Arguments *lt_00;
  size_t sVar5;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_RSI;
  undefined8 in_RDI;
  NLConstraint nlc;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> lc;
  bool need_nlc;
  int exprResVar;
  AlgConRange rng;
  QuadraticFunctionalConstraint exprTerm;
  LinTerms lt;
  undefined1 in_stack_0000091f;
  LinTerms *in_stack_00000920;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff8e0;
  LinTerms *in_stack_fffffffffffff8e8;
  LinTerms *in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff8f8;
  undefined1 fSort;
  undefined7 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff907;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff908;
  AlgConRange *this_00;
  AlgConRhs<_1> in_stack_fffffffffffff910;
  CtxVal local_6a4;
  undefined1 in_stack_fffffffffffff983;
  undefined4 in_stack_fffffffffffff984;
  int expr;
  NLConstraint *this_01;
  undefined4 uVar6;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_02;
  Context local_2b8;
  int local_2b4;
  double local_2b0;
  AlgConRhs<_1> local_2a8;
  AlgConRange local_2a0 [20];
  LinTerms *in_stack_fffffffffffffea8;
  QuadAndLinTerms *in_stack_fffffffffffffeb0;
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffeb8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *local_18;
  byte local_1;
  
  fSort = (undefined1)((ulong)in_stack_fffffffffffff8f8 >> 0x38);
  uVar6 = (undefined4)in_RDI;
  var = (int)((ulong)in_RDI >> 0x20);
  this_02 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)&stack0xffffffffffffff68;
  local_18 = in_RSI;
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff8e0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetBody(local_18);
  Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_2a8 = AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetRhsOrRange(local_18);
  this_01 = (NLConstraint *)AlgConRhs<-1>::lb(&local_2a8);
  local_2b0 = (double)AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetRhsOrRange
                                (local_18);
  dVar1 = AlgConRhs<-1>::ub((AlgConRhs<_1> *)0x1d6961);
  AlgConRange::AlgConRange(local_2a0,(double)this_01,dVar1);
  local_2b4 = -1;
  lt_00 = QuadraticFunctionalConstraint::GetArguments((QuadraticFunctionalConstraint *)0x1d6994);
  bVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::is_variable
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)in_stack_fffffffffffff8e0);
  expr = CONCAT13(bVar3,(int3)in_stack_fffffffffffff984);
  if (bVar3) {
    QuadraticFunctionalConstraint::GetArguments((QuadraticFunctionalConstraint *)0x1d69ce);
    local_2b4 = QuadAndLinTerms::get_representing_variable((QuadAndLinTerms *)0x1d69e5);
  }
  else {
    QuadraticFunctionalConstraint::GetArguments((QuadraticFunctionalConstraint *)0x1d6a40);
    bVar3 = QuadAndLinTerms::empty((QuadAndLinTerms *)in_stack_fffffffffffff8e0);
    if (!bVar3) {
      dVar1 = AlgConRange::lb(local_2a0);
      dVar2 = BasicFlatConverter::PracticallyMinusInf();
      if (dVar1 <= dVar2) {
        local_6a4 = CTX_NEG;
      }
      else {
        dVar1 = AlgConRange::ub(local_2a0);
        dVar2 = BasicFlatConverter::PracticallyInf();
        local_6a4 = CTX_POS;
        if (dVar1 < dVar2) {
          local_6a4 = CTX_MIX;
        }
      }
      Context::Context(&local_2b8,local_6a4);
      FunctionalConstraint::AddContext
                ((FunctionalConstraint *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (Context)(CtxVal)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
      local_2b4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>
                            (in_stack_fffffffffffff908,
                             (QuadraticFunctionalConstraint *)
                             CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    }
  }
  bVar3 = false;
  if (-1 < local_2b4) {
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                      (&in_stack_fffffffffffff8e0->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffff8dc);
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
                (&in_stack_fffffffffffff8e0->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffff8dc);
    }
    bVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::UserAcceptsAndRecommends<mp::NLConstraint>
                      (in_stack_fffffffffffff8e0,
                       (NLConstraint *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)
                      );
    if (!bVar4) {
      FlatModel<mp::DefaultFlatModelParams>::MarkAsResultVar
                (&in_stack_fffffffffffff8e0->super_FlatModel<mp::DefaultFlatModelParams>,
                 in_stack_fffffffffffff8dc);
    }
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      (&in_stack_fffffffffffff8e0->super_FlatModel<mp::DefaultFlatModelParams>,
                       in_stack_fffffffffffff8dc);
    if (bVar4) {
      LinTerms::add_term(in_stack_fffffffffffff8f0,(double)in_stack_fffffffffffff8e8,
                         (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
      LinTerms::sort_terms(in_stack_00000920,(bool)in_stack_0000091f);
      sVar5 = LinTerms::size((LinTerms *)0x1d6c33);
      if (sVar5 < 2) {
        this_00 = local_2a0;
        AlgConRange::lb(this_00);
        AlgConRange::ub(this_00);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::NarrowVarBounds(this_02,var,(double)this_01,(double)lt_00);
        local_1 = 1;
        goto LAB_001d6f90;
      }
      bVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                        (in_stack_fffffffffffff8e0,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                         CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      if (bVar3) {
        LinTerms::LinTerms(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetRhsOrRange(local_18);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff908,
                   (LinTerms *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                   in_stack_fffffffffffff910,(bool)fSort);
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff8e0);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff8e0,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_stack_fffffffffffff910.rhs_,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff908);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff8e0);
        local_1 = 1;
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff8e0);
        goto LAB_001d6f90;
      }
      bVar3 = true;
      local_2b4 = -1;
    }
  }
  if (((-1 < local_2b4) ||
      (bVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::
               UserAcceptsAndRecommends<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                         (in_stack_fffffffffffff8e0,
                          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)
                          CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)), !bVar4))
     || (bVar3)) {
    rng_00.lb_._4_4_ = var;
    rng_00.lb_._0_4_ = uVar6;
    rng_00.ub_ = (double)this_02;
    NLConstraint::NLConstraint
              (this_01,(LinTerms *)lt_00,expr,rng_00,(bool)in_stack_fffffffffffff983);
    in_stack_fffffffffffff8e0 =
         (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)(CONCAT44(var,uVar6) + -0x208);
    NLConstraint::NLConstraint
              ((NLConstraint *)in_stack_fffffffffffff8e0,
               (NLConstraint *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddConstraint<mp::NLConstraint>
              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)in_stack_fffffffffffff910.rhs_,(NLConstraint *)in_stack_fffffffffffff908);
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff8e0);
    local_1 = 1;
    NLConstraint::~NLConstraint((NLConstraint *)in_stack_fffffffffffff8e0);
  }
  else {
    local_1 = 0;
  }
LAB_001d6f90:
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)in_stack_fffffffffffff8e0);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff8e0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }